

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::LightSceneEntity::~LightSceneEntity(LightSceneEntity *this)

{
  std::__cxx11::string::~string((string *)&this->medium);
  SceneEntity::~SceneEntity((SceneEntity *)this);
  return;
}

Assistant:

LightSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const AnimatedTransform &renderFromLight, const std::string &medium)
        : TransformedSceneEntity(name, parameters, loc, renderFromLight),
          medium(medium) {}